

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O3

char * __thiscall Potassco::SmodelsConvert::getName(SmodelsConvert *this,Atom_t a)

{
  iterator iVar1;
  char *pcVar2;
  key_type local_4;
  
  iVar1 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_const_char_*>,_std::allocator<std::pair<const_unsigned_int,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->data_->symTab_)._M_h,&local_4);
  if (iVar1.super__Node_iterator_base<std::pair<const_unsigned_int,_const_char_*>,_false>._M_cur ==
      (__node_type *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = *(char **)((long)iVar1.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_const_char_*>,_false>
                              ._M_cur + 0x10);
  }
  return pcVar2;
}

Assistant:

const char* SmodelsConvert::getName(Atom_t a) const {
	SymTab::iterator it = data_->symTab_.find(a);
	return it != data_->symTab_.end() ? it->second : 0;
}